

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindow.cpp
# Opt level: O3

void __thiscall QMainWindow::setDockNestingEnabled(QMainWindow *this,bool enabled)

{
  QMainWindowLayout *this_00;
  undefined7 in_register_00000031;
  
  this_00 = *(QMainWindowLayout **)(*(long *)&(this->super_QWidget).field_0x8 + 0x260);
  QMainWindowLayout::setDockOptions
            (this_00,(DockOptions)
                     ((*(uint *)(this_00 + 0x700) & 0xfffffffd) +
                     (int)CONCAT71(in_register_00000031,enabled) * 2));
  return;
}

Assistant:

void QMainWindow::setDockNestingEnabled(bool enabled)
{
    Q_D(QMainWindow);

    DockOptions opts = d->layout->dockOptions;
    opts.setFlag(AllowNestedDocks, enabled);

    d->layout->setDockOptions(opts);
}